

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t main(wchar_t argc,char **argv)

{
  size_t sVar1;
  char **ppcVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  char *__s;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  _union_1457 _Stack_12e0;
  wchar_t test_num;
  sigaction sa;
  size_t testprg_len;
  char *testprg;
  char tmpdir_timestamp [32];
  char *vlevel;
  char *tmp2;
  char *testprogdir;
  char *pwd;
  char tmpdir [4096];
  char **local_1f0;
  char *p;
  char *option_arg;
  char *tmp;
  char **saved_argv;
  char *progname;
  char *refdir_alloc;
  tm tmbuf;
  tm *tmptr;
  time_t now;
  size_t tmp2_len;
  size_t tmplen;
  size_t testprogdir_len;
  uint local_158;
  wchar_t option;
  wchar_t tests_failed;
  wchar_t tests_run;
  wchar_t j;
  wchar_t i;
  wchar_t test_set [74];
  char **local_18;
  char **argv_local;
  wchar_t argc_local;
  
  tests_run = L'\0';
  tests_failed = L'\0';
  option = L'\0';
  local_158 = 0;
  vlevel = (char *)0x0;
  tmpdir_timestamp[0x18] = '\0';
  tmpdir_timestamp[0x19] = '\0';
  tmpdir_timestamp[0x1a] = '\0';
  tmpdir_timestamp[0x1b] = '\0';
  tmpdir_timestamp[0x1c] = '\0';
  tmpdir_timestamp[0x1d] = '\0';
  tmpdir_timestamp[0x1e] = '\0';
  tmpdir_timestamp[0x1f] = '\0';
  __s = getcwd((char *)0x0,0);
  while (sVar5 = strlen(__s), __s[sVar5 - 1] == '\n') {
    sVar5 = strlen(__s);
    __s[sVar5 - 1] = '\0';
  }
  local_1f0 = (char **)*argv;
  sVar5 = strlen((char *)local_1f0);
  tmplen = sVar5 + 1;
  tmp2 = (char *)malloc(tmplen);
  if (tmp2 == (char *)0x0) {
    fprintf(_stderr,"ERROR: Out of memory.");
    exit(1);
  }
  strncpy(tmp2,(char *)local_1f0,tmplen);
  saved_argv = local_1f0;
  for (; *(char *)local_1f0 != '\0'; local_1f0 = (char **)((long)local_1f0 + 1)) {
    if ((*(char *)local_1f0 == '/') || (*(char *)local_1f0 == '\\')) {
      saved_argv = (char **)((long)local_1f0 + 1);
      tests_run = tests_failed;
    }
    tests_failed = tests_failed + L'\x01';
  }
  tmp2[tests_run] = '\0';
  if (*tmp2 != '/') {
    sVar5 = strlen(__s);
    sVar6 = strlen(tmp2);
    tmp2 = (char *)realloc(tmp2,sVar5 + sVar6 + 2);
    if (tmp2 == (char *)0x0) {
      fprintf(_stderr,"ERROR: Out of memory.");
      exit(1);
    }
    sVar5 = strlen(__s);
    sVar6 = strlen(tmp2);
    memmove(tmp2 + sVar5 + 1,tmp2,sVar6 + 1);
    sVar5 = strlen(__s);
    memcpy(tmp2,__s,sVar5);
    sVar5 = strlen(__s);
    tmp2[sVar5] = '/';
  }
  testprogfile = getenv("BSDTAR");
  pcVar7 = getenv("TMPDIR");
  if (pcVar7 == (char *)0x0) {
    pcVar7 = getenv("TMP");
    if (pcVar7 == (char *)0x0) {
      pcVar7 = getenv("TEMP");
      if (pcVar7 == (char *)0x0) {
        pcVar7 = getenv("TEMPDIR");
        if (pcVar7 == (char *)0x0) {
          option_arg = "/tmp";
        }
        else {
          option_arg = getenv("TEMPDIR");
        }
      }
      else {
        option_arg = getenv("TEMP");
      }
    }
    else {
      option_arg = getenv("TMP");
    }
  }
  else {
    option_arg = getenv("TMPDIR");
  }
  tmp2_len = strlen(option_arg);
  while( true ) {
    bVar8 = false;
    if (tmp2_len != 0) {
      bVar8 = option_arg[tmp2_len - 1] == '/';
    }
    if (!bVar8) break;
    tmp2_len = tmp2_len - 1;
  }
  pcVar7 = getenv("BSDTAR_DEBUG");
  if (pcVar7 != (char *)0x0) {
    dump_on_failure = L'\x01';
  }
  pcVar7 = getenv("_VERBOSITY_LEVEL");
  if (pcVar7 != (char *)0x0) {
    tmpdir_timestamp._24_8_ = getenv("_VERBOSITY_LEVEL");
    verbosity = atoi((char *)tmpdir_timestamp._24_8_);
    if ((verbosity < L'\xffffffff') || (L'\x02' < verbosity)) {
      tmpdir_timestamp[0x18] = '\0';
      tmpdir_timestamp[0x19] = '\0';
      tmpdir_timestamp[0x1a] = '\0';
      tmpdir_timestamp[0x1b] = '\0';
      tmpdir_timestamp[0x1c] = '\0';
      tmpdir_timestamp[0x1d] = '\0';
      tmpdir_timestamp[0x1e] = '\0';
      tmpdir_timestamp[0x1f] = '\0';
      verbosity = L'\0';
    }
  }
  refdir = getenv("BSDTAR_TEST_FILES");
  local_18 = argv + 1;
  while ((ppcVar2 = local_18, *local_18 != (char *)0x0 && (**local_18 == '-'))) {
    local_1f0 = (char **)(*local_18 + 1);
    local_18 = local_18 + 1;
    while (*(char *)local_1f0 != '\0') {
      pcVar7 = (char *)((long)local_1f0 + 1);
      testprogdir_len._4_4_ = (uint)*(char *)local_1f0;
      p = (char *)0x0;
      if ((testprogdir_len._4_4_ == 0x70) ||
         (local_1f0 = (char **)pcVar7, testprogdir_len._4_4_ == 0x72)) {
        if (*pcVar7 == '\0') {
          if (*local_18 == (char *)0x0) {
            fprintf(_stderr,"Option -%c requires argument.\n",(ulong)testprogdir_len._4_4_);
            usage((char *)saved_argv);
            pcVar7 = p;
          }
          else {
            pcVar7 = *local_18;
            local_18 = local_18 + 1;
          }
        }
        p = pcVar7;
        local_1f0 = (char **)0x122e24;
      }
      switch(testprogdir_len._4_4_) {
      case 100:
        dump_on_failure = L'\x01';
        break;
      default:
        fprintf(_stderr,"Unrecognized option \'%c\'\n",(ulong)testprogdir_len._4_4_);
        usage((char *)saved_argv);
        break;
      case 0x6b:
        keep_temp_files = L'\x01';
        break;
      case 0x70:
        testprogfile = p;
        break;
      case 0x71:
        if (tmpdir_timestamp._24_8_ == 0) {
          verbosity = verbosity + L'\xffffffff';
        }
        break;
      case 0x72:
        refdir = p;
        break;
      case 0x73:
        fail_if_tests_skipped = L'\x01';
        break;
      case 0x75:
        until_failure = until_failure + L'\x01';
        break;
      case 0x76:
        if (tmpdir_timestamp._24_8_ == 0) {
          verbosity = verbosity + L'\x01';
        }
      }
    }
  }
  if (testprogfile == (char *)0x0) {
    sVar5 = strlen(tmp2);
    now = sVar5 + 8;
    vlevel = (char *)malloc(now);
    if (vlevel == (char *)0x0) {
      fprintf(_stderr,"ERROR: Out of memory.");
      exit(1);
    }
    strncpy(vlevel,tmp2,now);
    strncat(vlevel,"/",now);
    strncat(vlevel,"bsdtar",now);
    testprogfile = vlevel;
  }
  sVar5 = strlen(testprogfile);
  sa.sa_restorer = (_func_void *)(sVar5 + 3);
  pcVar7 = (char *)malloc((size_t)sa.sa_restorer);
  strncpy(pcVar7,"\"",(size_t)sa.sa_restorer);
  strncat(pcVar7,testprogfile,(size_t)sa.sa_restorer);
  strncat(pcVar7,"\"",(size_t)sa.sa_restorer);
  testprog = pcVar7;
  if ((refdir != (char *)0x0) && (*refdir != '/')) {
    fprintf(_stderr,"ERROR: Cannot use relative path for refdir\n");
    exit(1);
  }
  _Stack_12e0 = (_union_1457)0x1;
  sigemptyset((sigset_t *)&sa);
  sa.sa_mask.__val[0xf]._0_4_ = 0;
  sigaction(0xd,(sigaction *)&stack0xffffffffffffed20,(sigaction *)0x0);
  tmptr = (tm *)time((time_t *)0x0);
  tests_run = L'\0';
  while( true ) {
    tmbuf.tm_zone = (char *)localtime_r((time_t *)&tmptr,(tm *)&refdir_alloc);
    strftime((char *)&testprg,0x20,"%Y-%m-%dT%H.%M.%S",(tm *)tmbuf.tm_zone);
    sVar1 = tmp2_len;
    sVar5 = strlen((char *)saved_argv);
    sVar6 = strlen((char *)&testprg);
    if (0xfff < sVar1 + sVar5 + sVar6 + 6) {
      fprintf(_stderr,"ERROR: Temp directory pathname too long\n");
      exit(1);
    }
    snprintf((char *)&pwd,0x1000,"%.*s/%s.%s-%03d",tmp2_len & 0xffffffff,option_arg,saved_argv,
             &testprg,tests_run);
    wVar3 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                               ,L'ၛ',(char *)&pwd,L'ǭ');
    if (wVar3 != L'\0') break;
    if (L'Ϧ' < tests_run) {
      fprintf(_stderr,"ERROR: Unable to create temp directory %s\n",&pwd);
      exit(1);
    }
    tests_run = tests_run + L'\x01';
  }
  pcVar7 = get_refdir(refdir);
  refdir = pcVar7;
  printf("\n");
  printf("If tests fail or crash, details will be in:\n");
  printf("   %s\n",&pwd);
  printf("\n");
  local_18 = ppcVar2;
  if (verbosity < L'\0') {
    printf("Running ");
    fflush(_stdout);
  }
  else {
    printf("Reference files will be read from: %s\n",refdir);
    printf("Running tests on: %s\n",testprog);
    printf("Exercising: ");
    fflush(_stdout);
    systemf("%s --version",testprog);
    printf("%s\n","");
  }
  do {
    wVar3 = get_test_set(&j,L'J',*local_18);
    if (wVar3 < L'\0') {
      printf("*** INVALID Test %s\n",*local_18);
      free(pcVar7);
      free(tmp2);
      usage((char *)saved_argv);
    }
    for (tests_run = L'\0'; tests_run < wVar3; tests_run = tests_run + L'\x01') {
      option = option + L'\x01';
      wVar4 = test_run((&j)[tests_run],(char *)&pwd);
      if ((wVar4 != L'\0') && (local_158 = local_158 + 1, until_failure != L'\0'))
      goto LAB_0010821f;
    }
    if (*local_18 != (char *)0x0) {
      local_18 = local_18 + 1;
    }
  } while ((*local_18 != (char *)0x0) || (local_18 = ppcVar2, until_failure != L'\0'));
LAB_0010821f:
  free(vlevel);
  free(tmp2);
  free(__s);
  if (L'\xffffffff' < verbosity) {
    printf("\n");
    printf("Totals:\n");
    printf("  Tests run:         %8d\n",(ulong)(uint)option);
    printf("  Tests failed:      %8d\n",(ulong)local_158);
    printf("  Assertions checked:%8d\n",(ulong)(uint)assertions);
    printf("  Assertions failed: %8d\n",(ulong)(uint)failures);
    printf("  Skips reported:    %8d\n",(ulong)(uint)skips);
  }
  if (failures == L'\0') {
    if (verbosity == L'\xffffffff') {
      printf("\n");
    }
    printf("%d tests passed, no failures\n",(ulong)(uint)option);
  }
  else {
    printf("\n");
    printf("Failing tests:\n");
    for (tests_run = L'\0'; tests_run < L'J'; tests_run = tests_run + L'\x01') {
      if (tests[tests_run].failures != 0) {
        printf("  %d: %s (%d failures)\n",(ulong)(uint)tests_run,tests[tests_run].name,
               (ulong)(uint)tests[tests_run].failures);
      }
    }
    printf("\n");
    printf("Details for failing tests: %s\n",&pwd);
    printf("\n");
  }
  free(pcVar7);
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                  ,L'Ⴤ',"..");
  rmdir((char *)&pwd);
  if (local_158 == 0) {
    if ((fail_if_tests_skipped == L'\x01') && (L'\0' < skips)) {
      argv_local._4_4_ = L'\x02';
    }
    else {
      argv_local._4_4_ = L'\0';
    }
  }
  else {
    argv_local._4_4_ = L'\x01';
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char **argv)
{
	static const int limit = nitems(tests);
	int test_set[nitems(tests)];
	int i = 0, j = 0, tests_run = 0, tests_failed = 0, option;
	size_t testprogdir_len;
	size_t tmplen;
#ifdef PROGRAM
	size_t tmp2_len;
#endif
	time_t now;
	struct tm *tmptr;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif
	char *refdir_alloc = NULL;
	const char *progname;
	char **saved_argv;
	const char *tmp, *option_arg, *p;
#ifdef PATH_MAX
	char tmpdir[PATH_MAX];
#else
	char tmpdir[256];
#endif
	char *pwd, *testprogdir, *tmp2 = NULL, *vlevel = NULL;
	char tmpdir_timestamp[32];

	(void)argc; /* UNUSED */

	/* Get the current dir. */
#if defined(PATH_MAX) && !defined(__GLIBC__)
	pwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	pwd = getcwd(NULL, 0);
#endif
	while (pwd[strlen(pwd) - 1] == '\n')
		pwd[strlen(pwd) - 1] = '\0';

#if defined(HAVE__CrtSetReportMode) && !defined(__WATCOMC__)
	/* To stop to run the default invalid parameter handler. */
	_set_invalid_parameter_handler(invalid_parameter_handler);
	/* Disable annoying assertion message box. */
	_CrtSetReportMode(_CRT_ASSERT, 0);
#endif

	/*
	 * Name of this program, used to build root of our temp directory
	 * tree.
	 */
	progname = p = argv[0];
	testprogdir_len = strlen(progname) + 1;
	if ((testprogdir = malloc(testprogdir_len)) == NULL)
	{
		fprintf(stderr, "ERROR: Out of memory.");
		exit(1);
	}
	strncpy(testprogdir, progname, testprogdir_len);
	while (*p != '\0') {
		/* Support \ or / dir separators for Windows compat. */
		if (*p == '/' || *p == '\\')
		{
			progname = p + 1;
			i = j;
		}
		++p;
		j++;
	}
	testprogdir[i] = '\0';
#if defined(_WIN32) && !defined(__CYGWIN__)
	if (testprogdir[0] != '/' && testprogdir[0] != '\\' &&
	    !(((testprogdir[0] >= 'a' && testprogdir[0] <= 'z') ||
	       (testprogdir[0] >= 'A' && testprogdir[0] <= 'Z')) &&
		testprogdir[1] == ':' &&
		(testprogdir[2] == '/' || testprogdir[2] == '\\')))
#else
	if (testprogdir[0] != '/')
#endif
	{
		/* Fixup path for relative directories. */
		if ((testprogdir = realloc(testprogdir,
			strlen(pwd) + 1 + strlen(testprogdir) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		memmove(testprogdir + strlen(pwd) + 1, testprogdir,
		    strlen(testprogdir) + 1);
		memcpy(testprogdir, pwd, strlen(pwd));
		testprogdir[strlen(pwd)] = '/';
	}

#ifdef PROGRAM
	/* Get the target program from environment, if available. */
	testprogfile = getenv(ENVBASE);
#endif

	if (getenv("TMPDIR") != NULL)
		tmp = getenv("TMPDIR");
	else if (getenv("TMP") != NULL)
		tmp = getenv("TMP");
	else if (getenv("TEMP") != NULL)
		tmp = getenv("TEMP");
	else if (getenv("TEMPDIR") != NULL)
		tmp = getenv("TEMPDIR");
	else
		tmp = "/tmp";
	tmplen = strlen(tmp);
	while (tmplen > 0 && tmp[tmplen - 1] == '/')
		tmplen--;

	/* Allow -d to be controlled through the environment. */
	if (getenv(ENVBASE "_DEBUG") != NULL)
		dump_on_failure = 1;

	/* Allow -v to be controlled through the environment. */
	if (getenv("_VERBOSITY_LEVEL") != NULL)
	{
		vlevel = getenv("_VERBOSITY_LEVEL");
		verbosity = atoi(vlevel);
		if (verbosity < VERBOSITY_SUMMARY_ONLY || verbosity > VERBOSITY_FULL)
		{
			/* Unsupported verbosity levels are silently ignored */
			vlevel = NULL;
			verbosity = VERBOSITY_PASSFAIL;
		}
	}

	/* Get the directory holding test files from environment. */
	refdir = getenv(ENVBASE "_TEST_FILES");

	/*
	 * Parse options, without using getopt(), which isn't available
	 * on all platforms.
	 */
	++argv; /* Skip program name */
	while (*argv != NULL) {
		if (**argv != '-')
			break;
		p = *argv++;
		++p; /* Skip '-' */
		while (*p != '\0') {
			option = *p++;
			option_arg = NULL;
			/* If 'opt' takes an argument, parse that. */
			if (option == 'p' || option == 'r') {
				if (*p != '\0')
					option_arg = p;
				else if (*argv == NULL) {
					fprintf(stderr,
					    "Option -%c requires argument.\n",
					    option);
					usage(progname);
				} else
					option_arg = *argv++;
				p = ""; /* End of this option word. */
			}

			/* Now, handle the option. */
			switch (option) {
			case 'd':
				dump_on_failure = 1;
				break;
			case 'k':
				keep_temp_files = 1;
				break;
			case 'p':
#ifdef PROGRAM
				testprogfile = option_arg;
#else
				fprintf(stderr, "-p option not permitted\n");
				usage(progname);
#endif
				break;
			case 'q':
				if (!vlevel)
					verbosity--;
				break;
			case 'r':
				refdir = option_arg;
				break;
			case 's':
				fail_if_tests_skipped = 1;
				break;
			case 'u':
				until_failure++;
				break;
			case 'v':
				if (!vlevel)
					verbosity++;
				break;
			default:
				fprintf(stderr, "Unrecognized option '%c'\n",
				    option);
				usage(progname);
			}
		}
	}

	/*
	 * Sanity-check that our options make sense.
	 */
#ifdef PROGRAM
	if (testprogfile == NULL)
	{
		tmp2_len = strlen(testprogdir) + 1 + strlen(PROGRAM) + 1;
		if ((tmp2 = malloc(tmp2_len)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		strncpy(tmp2, testprogdir, tmp2_len);
		strncat(tmp2, "/", tmp2_len);
		strncat(tmp2, PROGRAM, tmp2_len);
		testprogfile = tmp2;
	}

	{
		char *testprg;
		size_t testprg_len;
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Command.com sometimes rejects '/' separators. */
		testprg = strdup(testprogfile);
		for (i = 0; testprg[i] != '\0'; i++) {
			if (testprg[i] == '/')
				testprg[i] = '\\';
		}
		testprogfile = testprg;
#endif
		/* Quote the name that gets put into shell command lines. */
		testprg_len = strlen(testprogfile) + 3;
		testprg = malloc(testprg_len);
		strncpy(testprg, "\"", testprg_len);
		strncat(testprg, testprogfile, testprg_len);
		strncat(testprg, "\"", testprg_len);
		testprog = testprg;
	}

	/* Sanity check: reject a relative path for refdir. */
	if (refdir != NULL) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* TODO: probably use PathIsRelative() from <shlwapi.h>. */
#else
		if (refdir[0] != '/') {
			fprintf(stderr,
			    "ERROR: Cannot use relative path for refdir\n");
			exit(1);
		}
#endif
	}
#endif

#if !defined(_WIN32) && defined(SIGPIPE)
	{   /* Ignore SIGPIPE signals */
		struct sigaction sa;
		sa.sa_handler = SIG_IGN;
		sigemptyset(&sa.sa_mask);
		sa.sa_flags = 0;
		sigaction(SIGPIPE, &sa, NULL);
	}
#endif

	/*
	 * Create a temp directory for the following tests.
	 * Include the time the tests started as part of the name,
	 * to make it easier to track the results of multiple tests.
	 */
	now = time(NULL);
	for (i = 0; ; i++) {
#if defined(HAVE_LOCALTIME_S)
		tmptr = localtime_s(&tmbuf, &now) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
		tmptr = localtime_r(&now, &tmbuf);
#else
		tmptr = localtime(&now);
#endif
		strftime(tmpdir_timestamp, sizeof(tmpdir_timestamp),
		    "%Y-%m-%dT%H.%M.%S", tmptr);
		if (tmplen + 1 + strlen(progname) + 1 +
		    strlen(tmpdir_timestamp) + 1 + 3 >=
		    nitems(tmpdir)) {
			fprintf(stderr,
			    "ERROR: Temp directory pathname too long\n");
			exit(1);
		}
		snprintf(tmpdir, sizeof(tmpdir), "%.*s/%s.%s-%03d",
		    (int)tmplen, tmp, progname, tmpdir_timestamp, i);
		if (assertMakeDir(tmpdir, 0755))
			break;
		if (i >= 999) {
			fprintf(stderr,
			    "ERROR: Unable to create temp directory %s\n",
			    tmpdir);
			exit(1);
		}
	}

	/*
	 * If the user didn't specify a directory for locating
	 * reference files, try to find the reference files in
	 * the "usual places."
	 */
	refdir = refdir_alloc = get_refdir(refdir);

	/*
	 * Banner with basic information.
	 */
	printf("\n");
	printf("If tests fail or crash, details will be in:\n");
	printf("   %s\n", tmpdir);
	printf("\n");
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("Reference files will be read from: %s\n", refdir);
#ifdef PROGRAM
		printf("Running tests on: %s\n", testprog);
#endif
		printf("Exercising: ");
		fflush(stdout);
		printf("%s\n", EXTRA_VERSION);
	} else {
		printf("Running ");
		fflush(stdout);
	}

	/*
	 * Run some or all of the individual tests.
	 */
	saved_argv = argv;
	do {
		argv = saved_argv;
		do {
			int test_num;

			test_num = get_test_set(test_set, limit, *argv);
			if (test_num < 0) {
				printf("*** INVALID Test %s\n", *argv);
				free(refdir_alloc);
				free(testprogdir);
				usage(progname);
			}
			for (i = 0; i < test_num; i++) {
				tests_run++;
				if (test_run(test_set[i], tmpdir)) {
					tests_failed++;
					if (until_failure)
						goto finish;
				}
			}
			if (*argv != NULL)
				argv++;
		} while (*argv != NULL);
	} while (until_failure);

finish:
	/* Must be freed after all tests run */
	free(tmp2);
	free(testprogdir);
	free(pwd);

	/*
	 * Report summary statistics.
	 */
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("\n");
		printf("Totals:\n");
		printf("  Tests run:         %8d\n", tests_run);
		printf("  Tests failed:      %8d\n", tests_failed);
		printf("  Assertions checked:%8d\n", assertions);
		printf("  Assertions failed: %8d\n", failures);
		printf("  Skips reported:    %8d\n", skips);
	}
	if (failures) {
		printf("\n");
		printf("Failing tests:\n");
		for (i = 0; i < limit; ++i) {
			if (tests[i].failures)
				printf("  %d: %s (%d failures)\n", i,
				    tests[i].name, tests[i].failures);
		}
		printf("\n");
		printf("Details for failing tests: %s\n", tmpdir);
		printf("\n");
	} else {
		if (verbosity == VERBOSITY_SUMMARY_ONLY)
			printf("\n");
		printf("%d tests passed, no failures\n", tests_run);
	}

	free(refdir_alloc);

	/* If the final tmpdir is empty, we can remove it. */
	/* This should be the usual case when all tests succeed. */
	assertChdir("..");
	rmdir(tmpdir);

	if (tests_failed) return 1;

	if (fail_if_tests_skipped == 1 && skips > 0) return 2;

	return 0;
}